

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qx509_base.cpp
# Opt level: O1

QByteArray *
QTlsPrivate::X509CertificateBase::subjectInfoToString
          (QByteArray *__return_storage_ptr__,SubjectInfo info)

{
  QArrayData *pQVar1;
  qsizetype qVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  QByteArray local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  switch(info) {
  case Organization:
    pcVar3 = "O";
    break;
  case CommonName:
    pcVar3 = "CN";
    break;
  case LocalityName:
    pcVar3 = "L";
    break;
  case OrganizationalUnitName:
    pcVar3 = "OU";
    break;
  case CountryName:
    pcVar3 = "C";
    break;
  case StateOrProvinceName:
    pcVar3 = "ST";
    break;
  case DistinguishedNameQualifier:
    pcVar3 = "dnQualifier";
    break;
  case SerialNumber:
    pcVar3 = "serialNumber";
    break;
  case EmailAddress:
    pcVar3 = "emailAddress";
    break;
  default:
    goto switchD_001101af_default;
  }
  QByteArray::QByteArray(&local_38,pcVar3,-1);
  pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
  pcVar3 = (__return_storage_ptr__->d).ptr;
  *(undefined4 *)&(__return_storage_ptr__->d).d = local_38.d.d._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = local_38.d.d._4_4_;
  *(undefined4 *)&(__return_storage_ptr__->d).ptr = local_38.d.ptr._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = local_38.d.ptr._4_4_;
  qVar2 = (__return_storage_ptr__->d).size;
  (__return_storage_ptr__->d).size = local_38.d.size;
  local_38.d.d = (Data *)pQVar1;
  local_38.d.ptr = pcVar3;
  local_38.d.size = qVar2;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,1,0x10);
    }
  }
switchD_001101af_default:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray X509CertificateBase::subjectInfoToString(QSslCertificate::SubjectInfo info)
{
    QByteArray str;
    switch (info) {
    case QSslCertificate::Organization: str = QByteArray("O"); break;
    case QSslCertificate::CommonName: str = QByteArray("CN"); break;
    case QSslCertificate::LocalityName: str = QByteArray("L"); break;
    case QSslCertificate::OrganizationalUnitName: str = QByteArray("OU"); break;
    case QSslCertificate::CountryName: str = QByteArray("C"); break;
    case QSslCertificate::StateOrProvinceName: str = QByteArray("ST"); break;
    case QSslCertificate::DistinguishedNameQualifier: str = QByteArray("dnQualifier"); break;
    case QSslCertificate::SerialNumber: str = QByteArray("serialNumber"); break;
    case QSslCertificate::EmailAddress: str = QByteArray("emailAddress"); break;
    }

    return str;
}